

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gibbs_sampling_three.cpp
# Opt level: O1

int main(void)

{
  double dVar1;
  uint uVar2;
  time_t tVar3;
  ostream *poVar4;
  int iVar5;
  ulong uVar6;
  double r1;
  double r2;
  double local_80;
  undefined1 local_78 [16];
  double local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  double local_38;
  
  iVar5 = 0;
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  local_78 = ZEXT816(0);
  uVar6 = 1;
  local_68 = 0.0;
  uStack_60 = 0;
  do {
    uVar2 = local_78._12_4_;
    local_78._8_4_ = local_78._8_4_;
    local_78._0_8_ = -(double)local_78._0_8_ - local_68;
    local_78._12_4_ = uVar2 ^ 0x80000000;
    BoxMuller(&local_80,&local_38);
    dVar1 = local_78._0_8_ + local_80;
    local_58._8_4_ = local_78._8_4_;
    local_58._0_8_ = dVar1;
    local_58._12_4_ = local_78._12_4_;
    dVar1 = dVar1 * -0.5;
    local_48._8_4_ = local_78._8_4_;
    local_48._0_8_ = dVar1;
    local_48._12_4_ = local_78._12_4_;
    local_68 = local_68 * -0.5 + dVar1;
    BoxMuller(&local_80,&local_38);
    local_78._8_8_ = 0;
    local_78._0_8_ = local_80 * 0.7071067811865475 + local_68;
    BoxMuller(&local_80,&local_38);
    uStack_60 = 0;
    local_68 = local_80 * 0.7071067811865475;
    if ((int)(uVar6 / 10) * -10 + 1 == iVar5) {
      uStack_60 = 0;
      poVar4 = std::ostream::_M_insert<double>((double)local_58._0_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
      poVar4 = std::ostream::_M_insert<double>((double)local_78._0_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
      poVar4 = std::ostream::_M_insert<double>((double)local_58._0_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
    local_68 = local_68 + (double)local_48._0_8_ + (double)local_78._0_8_ * -0.5;
    iVar5 = iVar5 + -1;
    uVar6 = (ulong)((int)uVar6 + 1);
  } while (iVar5 != -10000);
  return 0;
}

Assistant:

int main() {
    double A[3][3];
    A[0][0] = 1e0, A[1][1] = 2e0, A[2][2] = 2e0;
    A[0][1] = 1e0, A[0][2] = 1e0, A[1][2] = 1e0;
    A[1][0] = A[0][1], A[2][0] = A[0][2], A[2][1] = A[1][2];

    srand((unsigned) time(nullptr));
    double x = 0e0, y = 0e0, z = 0e0;
    for (int iter = 0; iter < niter; iter++) {
        double sigma, mu;
        double r1, r2;

        // x更新
        sigma = 1e0 / sqrt(A[0][0]);
        mu = -A[0][1] / A[0][0] * y - A[0][2] / A[0][0] * z;
        BoxMuller(r1, r2);
        x = sigma * r1 + mu;

        // y更新
        sigma = 1e0 / sqrt(A[1][1]);
        mu = -A[1][0] / A[1][1] * x - A[1][2] / A[1][1] * z;
        BoxMuller(r1, r2);
        y = sigma * r1 + mu;

        // x更新
        sigma = 1e0 / sqrt(A[2][2]);
        mu = -A[2][0] / A[2][2] * x - A[2][1] / A[2][2] * y;
        BoxMuller(r1, r2);
        z = sigma * r1 + mu;

        if ((iter + 1) % 10 == 0) {
            std::cout << x << "  " << y << "  " << x << std::endl;
        }
    }
    return 0;
}